

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O3

void try_reference(void)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined4 *puVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  
  iVar6 = 0x1000000;
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    if (must_throw == true) {
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  lVar2 = std::chrono::_V2::system_clock::now();
  dVar7 = (double)(lVar2 - lVar1) / 1000000000.0;
  dVar8 = dVar7 * 1000.0 * 1000.0 * 1000.0 * 5.9604644775390625e-08;
  expand_name("try_reference");
  sVar3 = strlen(expand_name::buf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,expand_name::buf,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar4 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ns per operation,\t",0x12);
  poVar4 = std::ostream::_M_insert<double>(dVar8 / unit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ticks,\t",8);
  poVar4 = std::ostream::_M_insert<double>(((16777216.0 / dVar7) / 1000.0) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Mrps",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

static void __attribute__((noinline))
try_reference()
{
    now_t start = now();
    const size_t COUNT = SIZE;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        if (must_throw)
            throw 0;
    }
    now_t stop = now();

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;

}